

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O0

int qc_tcp_recv(QcSocket *socket,char *recvbuf,int len)

{
  ssize_t sVar1;
  int bytes;
  int len_local;
  char *recvbuf_local;
  QcSocket *socket_local;
  
  sVar1 = recv(socket->sockfd,recvbuf,(long)len,0x4000);
  socket_local._4_4_ = (int)sVar1;
  if (socket_local._4_4_ < 0) {
    _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
              ,0xe7,"tcp recv failed");
    socket_local._4_4_ = -1;
  }
  else if (socket_local._4_4_ == 0) {
    socket_local._4_4_ = 0;
  }
  return socket_local._4_4_;
}

Assistant:

int qc_tcp_recv(QcSocket *socket, char *recvbuf, int len)
{
    int bytes;

    bytes = (int)recv(socket->sockfd, recvbuf, len, MSG_NOSIGNAL);
    if(bytes < 0)
    {
        qc_error("tcp recv failed");
        return -1;
    }
    else if(0 == bytes)
        return 0;  /*Connection closed*/

    return bytes;
}